

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::setBspTreeDepth(QGraphicsScene *this,int depth)

{
  QGraphicsScenePrivate *this_00;
  QGraphicsSceneBspTreeIndex *pQVar1;
  uint in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QGraphicsSceneBspTreeIndex *bspTree;
  QGraphicsScenePrivate *d;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsScene *)0x9ca879);
  if ((int)in_ESI < 0) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8),
               (int)((ulong)this_00 >> 0x20),in_stack_ffffffffffffff98);
    QMessageLogger::warning
              (local_28,"QGraphicsScene::setBspTreeDepth: invalid depth %d ignored; must be >= 0",
               (ulong)in_ESI);
  }
  else {
    pQVar1 = qobject_cast<QGraphicsSceneBspTreeIndex*>((QObject *)0x9ca8c2);
    if (pQVar1 == (QGraphicsSceneBspTreeIndex *)0x0) {
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8),
                 (int)((ulong)this_00 >> 0x20),(char *)0x0);
      QMessageLogger::warning
                (local_48,
                 "QGraphicsScene::setBspTreeDepth: cannot apply if indexing method is not BSP");
    }
    else {
      QGraphicsSceneBspTreeIndex::setBspTreeDepth
                ((QGraphicsSceneBspTreeIndex *)this_00,(int)((ulong)pQVar1 >> 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::setBspTreeDepth(int depth)
{
    Q_D(QGraphicsScene);
    if (depth < 0) {
        qWarning("QGraphicsScene::setBspTreeDepth: invalid depth %d ignored; must be >= 0", depth);
        return;
    }

    QGraphicsSceneBspTreeIndex *bspTree = qobject_cast<QGraphicsSceneBspTreeIndex *>(d->index);
    if (!bspTree) {
        qWarning("QGraphicsScene::setBspTreeDepth: cannot apply if indexing method is not BSP");
        return;
    }
    bspTree->setBspTreeDepth(depth);
}